

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O1

void __thiscall
basisu::vector<basist::ktx2_transcoder::key_value>::~vector
          (vector<basist::ktx2_transcoder::key_value> *this)

{
  uint uVar1;
  key_value *pkVar2;
  void *pvVar3;
  long lVar4;
  
  pkVar2 = this->m_p;
  if (pkVar2 != (key_value *)0x0) {
    uVar1 = this->m_size;
    if ((ulong)uVar1 != 0) {
      lVar4 = 0;
      do {
        pvVar3 = *(void **)((long)&(pkVar2->m_value).m_p + lVar4);
        if (pvVar3 != (void *)0x0) {
          free(pvVar3);
        }
        pvVar3 = *(void **)((long)&(pkVar2->m_key).m_p + lVar4);
        if (pvVar3 != (void *)0x0) {
          free(pvVar3);
        }
        lVar4 = lVar4 + 0x20;
      } while ((ulong)uVar1 << 5 != lVar4);
    }
    free(this->m_p);
    return;
  }
  return;
}

Assistant:

inline ~vector()
      {
         if (m_p)
         {
            scalar_type<T>::destruct_array(m_p, m_size);
            free(m_p);
         }
      }